

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_unsigned_long>
google::protobuf::internal::VarintParseSlow64(char *p,uint32 res32)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  ulong uVar4;
  pair<const_char_*,_unsigned_long> pVar5;
  
  uVar4 = (ulong)res32;
  pbVar2 = (byte *)(p + 2);
  lVar3 = 0xe;
  do {
    if (lVar3 == 0x46) {
      pbVar2 = (byte *)0x0;
      uVar4 = 0;
      break;
    }
    bVar1 = *pbVar2;
    uVar4 = uVar4 + ((ulong)bVar1 - 1 << ((byte)lVar3 & 0x3f));
    pbVar2 = pbVar2 + 1;
    lVar3 = lVar3 + 7;
  } while ((char)bVar1 < '\0');
  pVar5.second = uVar4;
  pVar5.first = (char *)pbVar2;
  return pVar5;
}

Assistant:

std::pair<const char*, uint64> VarintParseSlow64(const char* p, uint32 res32) {
  uint64 res = res32;
  for (std::uint32_t i = 2; i < 10; i++) {
    uint64 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}